

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O0

nodetree * NodeTree_CreateChild(void *p,tchar_t *Name,fourcc_t ClassId,void *Before)

{
  nodetree *pnVar1;
  nodetree *Child;
  void *Before_local;
  fourcc_t ClassId_local;
  tchar_t *Name_local;
  void *p_local;
  
  pnVar1 = (nodetree *)NodeCreate(p,ClassId);
  if (pnVar1 != (nodetree *)0x0) {
    if (pnVar1 == (nodetree *)0x0) {
      __assert_fail("(const void*)(Child)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                    ,0x73,
                    "nodetree *NodeTree_CreateChild(void *, const tchar_t *, fourcc_t, void *)");
    }
    (**(code **)((long)(pnVar1->Base).VMT + 0x48))(pnVar1,p,Before);
    if ((Name != (tchar_t *)0x0) && (*Name != '\0')) {
      if (pnVar1 == (nodetree *)0x0) {
        __assert_fail("(const void*)((node*)Child)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                      ,0x75,
                      "nodetree *NodeTree_CreateChild(void *, const tchar_t *, fourcc_t, void *)");
      }
      (**(code **)((long)(pnVar1->Base).VMT + 0x40))(pnVar1,5,4,Name);
    }
  }
  return pnVar1;
}

Assistant:

NOINLINE nodetree* NodeTree_CreateChild(void* p, const tchar_t* Name, fourcc_t ClassId, void* Before)
{
    nodetree* Child = (nodetree*)NodeCreate(p,ClassId);
    if (Child)
    {
        NodeTree_SetParent(Child,p,Before);
        if (Name && Name[0])
            Node_SetData((node*)Child,NODE_ID,TYPE_STRING,Name);
    }
    return Child;
}